

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGraph.cpp
# Opt level: O2

void __thiscall
Hpipe::InstructionGraph::make_rewind_exec
          (InstructionGraph *this,InstructionMark *mark,InstructionRewind *rewind)

{
  uint *puVar1;
  Instruction *pIVar2;
  bool bVar3;
  _Elt_pointer pPVar4;
  iterator iVar5;
  Instruction *pIVar6;
  size_type sVar7;
  _Base_ptr p_Var8;
  uint *puVar9;
  Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00;
  pointer pTVar10;
  PendingRewindTrans pt;
  anon_class_32_4_fc640c73 reg;
  Vec<unsigned_int> keep_ind;
  map<Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*,_std::less<Hpipe::InstructionGraph::RewindContext>,_std::allocator<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>_>
  instruction_map;
  deque<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
  pending_trans;
  InstructionMark *local_180;
  Instruction *local_178;
  undefined8 uStack_170;
  InstructionRewind *local_168;
  Vec<unsigned_int> *local_160;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_158;
  Transition local_140;
  anon_class_32_4_fc640c73 local_118;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_f8;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_e0;
  _Rb_tree<Hpipe::InstructionGraph::RewindContext,_std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>,_std::_Select1st<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>,_std::less<Hpipe::InstructionGraph::RewindContext>,_std::allocator<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>_>
  local_c8;
  _Deque_base<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
  local_98;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._M_impl.super__Rb_tree_header._M_header;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_180 = mark;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  _Deque_base<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
  ::_Deque_base(&local_98);
  local_118.instruction_map =
       (map<Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*,_std::less<Hpipe::InstructionGraph::RewindContext>,_std::allocator<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>_>
        *)&local_c8;
  local_118.mark = &local_180;
  local_118.this = this;
  local_118.pending_trans =
       (deque<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
        *)&local_98;
  range_vec<unsigned_int>
            ((Vec<unsigned_int> *)&local_e0,
             (uint)((ulong)((long)*(pointer *)
                                   ((long)&(rewind->super_Instruction).cx.pos.
                                           super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                           .
                                           super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                           ._M_impl.super__Vector_impl_data + 8) -
                           (long)(rewind->super_Instruction).cx.pos.
                                 super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                 .
                                 super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3));
  make_rewind_exec::anon_class_32_4_fc640c73::operator()
            (&local_118,&rewind->super_Instruction,(Vec<unsigned_int> *)&local_e0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_e0);
  local_160 = &(rewind->super_Instruction).cx.paths_to_mark;
  local_168 = rewind;
  while (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         local_98._M_impl.super__Deque_impl_data._M_start._M_cur) {
    pPVar4 = local_98._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_98._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pPVar4 = local_98._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    local_178 = pPVar4[-1].new_inst;
    uStack_170._0_4_ = pPVar4[-1].num_prev;
    uStack_170._4_4_ = pPVar4[-1].num_next;
    std::
    deque<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
    ::pop_back((deque<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
                *)&local_98);
    local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pTVar10 = (local_178->orig->prev).
              super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
              super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
              super__Vector_impl_data._M_start + (uStack_170 & 0xffffffff);
    puVar1 = (local_178->orig_keed_ind).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar9 = (local_178->orig_keed_ind).
                  super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start; puVar9 != puVar1; puVar9 = puVar9 + 1) {
      Vec<unsigned_int>::push_back_unique<unsigned_int&>
                ((Vec<unsigned_int> *)&local_f8,
                 (uint *)((ulong)*puVar9 * 4 +
                         *(long *)&(pTVar10->rcitem).
                                   super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>))
      ;
    }
    local_140.inst = pTVar10->inst;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_140.rcitem.super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f8);
    iVar5 = std::
            _Rb_tree<Hpipe::InstructionGraph::RewindContext,_std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>,_std::_Select1st<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>,_std::less<Hpipe::InstructionGraph::RewindContext>,_std::allocator<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>_>
            ::find(&local_c8,(key_type *)&local_140);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_140.rcitem);
    if ((_Rb_tree_header *)iVar5._M_node == &local_c8._M_impl.super__Rb_tree_header) {
      pIVar6 = pTVar10->inst;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f8);
      pIVar6 = make_rewind_exec::anon_class_32_4_fc640c73::operator()
                         (&local_118,pIVar6,(Vec<unsigned_int> *)&local_48);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
    }
    else {
      pIVar6 = *(Instruction **)(iVar5._M_node + 2);
    }
    Vec<Hpipe::Vec<Hpipe::Transition>>::secure_push_back<Hpipe::Instruction*>
              ((Vec<Hpipe::Vec<Hpipe::Transition>> *)&pIVar6->next_rw,uStack_170._4_4_,&local_178);
    pIVar2 = local_178;
    local_158._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_158._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_158._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Transition::Transition(&local_140,pIVar6,(Vec<unsigned_int> *)&local_158,-1.0);
    std::vector<Hpipe::Transition,std::allocator<Hpipe::Transition>>::
    emplace_back<Hpipe::Transition_const&>
              ((vector<Hpipe::Transition,std::allocator<Hpipe::Transition>> *)&pIVar2->prev,
               &local_140);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_140.rcitem);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_158);
    if ((InstructionMark *)pTVar10->inst == local_180) {
      Vec<unsigned_int>::uniqued((Vec<unsigned_int> *)&local_140,local_160);
      bVar3 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f8,
                              (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_140);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_140);
      if (bVar3) {
        local_168->exec = pIVar6;
      }
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_f8);
  }
  pIVar6 = &local_180->super_Instruction;
  pIVar2 = &local_168->super_Instruction;
  this_00 = &local_168->strs_to_cancel;
  for (p_Var8 = *(_Base_ptr *)
                 ((long)&(local_180->super_Instruction).cx.paths_to_strings._M_t._M_impl.
                         super__Rb_tree_header._M_header + 0x10);
      (_Rb_tree_header *)p_Var8 != &(pIVar6->cx).paths_to_strings._M_t._M_impl.super__Rb_tree_header
      ; p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
    sVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hpipe::Vec<unsigned_int>_>_>_>
            ::count(&(pIVar2->cx).paths_to_strings,(key_type *)(p_Var8 + 1));
    if (sVar7 == 0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var8 + 1));
    }
  }
  std::
  _Deque_base<Hpipe::InstructionGraph::PendingRewindTrans,_std::allocator<Hpipe::InstructionGraph::PendingRewindTrans>_>
  ::~_Deque_base(&local_98);
  std::
  _Rb_tree<Hpipe::InstructionGraph::RewindContext,_std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>,_std::_Select1st<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>,_std::less<Hpipe::InstructionGraph::RewindContext>,_std::allocator<std::pair<const_Hpipe::InstructionGraph::RewindContext,_Hpipe::Instruction_*>_>_>
  ::~_Rb_tree(&local_c8);
  return;
}

Assistant:

void InstructionGraph::make_rewind_exec( InstructionMark *mark, InstructionRewind *rewind ) {
    // we start from the end
    std::map<RewindContext,Instruction *> instruction_map; // [ orig, keep_ind ] => new instruction
    std::deque<PendingRewindTrans> pending_trans; //

    auto reg = [&]( Instruction *orig, Vec<unsigned> orig_keep_ind ) {
        Instruction *new_inst = orig->clone( inst_pool, orig->cx.keep_only( orig_keep_ind ).first.without_mark().first, orig_keep_ind );
        instruction_map[ RewindContext{ orig, orig_keep_ind } ] = new_inst;
        new_inst->running_strs = orig->running_strs;
        new_inst->orig_keed_ind = orig_keep_ind;
        new_inst->orig = orig;

        // look into prevs
        if ( orig != mark ) {
            std::set<Instruction *> prevs;
            for( unsigned num_prev = 0; num_prev < orig->prev.size(); ++num_prev ) {
                Instruction *prev = orig->prev[ num_prev ].inst;
                if ( prevs.count( prev ) )
                    continue;
                prevs.insert( prev );
                for( unsigned num_next = 0; num_next < prev->next.size(); ++num_next )
                    if ( prev->next[ num_next ].inst == orig )
                        pending_trans.emplace_back( new_inst, num_prev, num_next );
            }
        }

        return new_inst;
    };

    reg( rewind, range_vec( unsigned( rewind->cx.pos.size() ) ) );
    while ( ! pending_trans.empty() ) {
        PendingRewindTrans pt = pending_trans.back();
        pending_trans.pop_back();

        Vec<unsigned> keep_ind;
        Transition &t = pt.new_inst->orig->prev[ pt.num_prev ];
        for( unsigned keep_ind_next : pt.new_inst->orig_keed_ind )
            keep_ind.push_back_unique( t.rcitem[ keep_ind_next ] );

        // make the new instruction if not already done
        auto iter = instruction_map.find( RewindContext{ t.inst, keep_ind } );
        Instruction *new_inst = iter == instruction_map.end() ? reg( t.inst, keep_ind ) : iter->second;

        // std::cout << pt.new_inst->orig->get_display_id() << "\t->\t" << t.inst->get_display_id() << "\tki=[" << keep_ind << "]:\t" << new_inst->get_display_id() << "\t-> " << *new_inst << std::endl;

        // register in the graph
        new_inst->next_rw.secure_push_back( pt.num_next, pt.new_inst );
        pt.new_inst->prev << new_inst;

        //
        if ( t.inst == mark && keep_ind == rewind->cx.paths_to_mark.uniqued() )
            rewind->exec = new_inst;
    }

    // strings present in mark but not in rewind
    for( const auto &mp : mark->cx.paths_to_strings )
        if ( ! rewind->cx.paths_to_strings.count( mp.first ) )
            rewind->strs_to_cancel << mp.first;
}